

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install.cpp
# Opt level: O1

unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
__thiscall
duckdb::ExtensionHelper::InstallExtensionInternal
          (ExtensionHelper *this,DatabaseInstance *db,FileSystem *fs,string *param_3,
          string *extension,ExtensionInstallOptions *options,
          optional_ptr<duckdb::HTTPLogger,_true> http_logger,
          optional_ptr<duckdb::ClientContext,_true> context)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t __n;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  undefined8 *puVar7;
  pointer pcVar8;
  pointer pEVar9;
  PermissionException *this_00;
  InvalidInputException *pIVar10;
  ExtensionRepository *b;
  char cVar11;
  pointer *__ptr;
  undefined8 uVar12;
  hugeint_t hVar13;
  hugeint_t input;
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
  install_info;
  ExtensionRepository resolved_repository;
  optional_ptr<duckdb::ExtensionRepository,_true> local_1f8;
  string repo;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  undefined1 local_1c0 [16];
  string temp_path;
  string local_extension_path;
  string extension_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string custom_path;
  string local_50;
  
  if ((db->config).options.enable_external_access == false) {
    this_00 = (PermissionException *)__cxa_allocate_exception(0x10);
    resolved_repository.name._M_dataplus._M_p = (pointer)&resolved_repository.name.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&resolved_repository,
               "Installing extensions is disabled through configuration","");
    PermissionException::PermissionException(this_00,&resolved_repository.name);
    __cxa_throw(this_00,&PermissionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  FileSystem::ExtractBaseName(&resolved_repository.name,fs,extension);
  ApplyExtensionAlias(&extension_name,&resolved_repository.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resolved_repository.name._M_dataplus._M_p != &resolved_repository.name.field_2) {
    operator_delete(resolved_repository.name._M_dataplus._M_p);
  }
  resolved_repository.name._M_dataplus._M_p = (pointer)&resolved_repository.name.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&resolved_repository,extension_name._M_dataplus._M_p,
             extension_name._M_dataplus._M_p + extension_name._M_string_length);
  ::std::__cxx11::string::append((char *)&resolved_repository);
  b = &resolved_repository;
  FileSystem::JoinPath(&local_extension_path,fs,param_3,&b->name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resolved_repository.name._M_dataplus._M_p != &resolved_repository.name.field_2) {
    operator_delete(resolved_repository.name._M_dataplus._M_p);
  }
  resolved_repository.name._M_dataplus._M_p = (pointer)&resolved_repository.name.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&resolved_repository,local_extension_path._M_dataplus._M_p,
             local_extension_path._M_dataplus._M_p + local_extension_path._M_string_length);
  ::std::__cxx11::string::append((char *)&resolved_repository);
  hVar13 = UUID::GenerateRandomUUID();
  input.lower = hVar13.upper;
  input.upper = (int64_t)b;
  BaseUUID::ToString_abi_cxx11_(&repo,(BaseUUID *)hVar13.lower,input);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resolved_repository.name._M_dataplus._M_p != &resolved_repository.name.field_2) {
    uVar12 = resolved_repository.name.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < repo._M_string_length + resolved_repository.name._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)repo._M_dataplus._M_p != &repo.field_2) {
      uVar12 = repo.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < repo._M_string_length + resolved_repository.name._M_string_length)
    goto LAB_00f75e06;
    puVar7 = (undefined8 *)
             ::std::__cxx11::string::replace
                       ((ulong)&repo,0,(char *)0x0,(ulong)resolved_repository.name._M_dataplus._M_p)
    ;
  }
  else {
LAB_00f75e06:
    puVar7 = (undefined8 *)
             ::std::__cxx11::string::_M_append
                       ((char *)&resolved_repository,(ulong)repo._M_dataplus._M_p);
  }
  temp_path._M_dataplus._M_p = (pointer)&temp_path.field_2;
  psVar1 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar1) {
    temp_path.field_2._M_allocated_capacity = *psVar1;
    temp_path.field_2._8_8_ = puVar7[3];
  }
  else {
    temp_path.field_2._M_allocated_capacity = *psVar1;
    temp_path._M_dataplus._M_p = (pointer)*puVar7;
  }
  temp_path._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(char *)psVar1 = '\0';
  paVar2 = &repo.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)repo._M_dataplus._M_p != paVar2) {
    operator_delete(repo._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resolved_repository.name._M_dataplus._M_p != &resolved_repository.name.field_2) {
    operator_delete(resolved_repository.name._M_dataplus._M_p);
  }
  iVar6 = (*fs->_vptr_FileSystem[0x12])(fs,&local_extension_path,0);
  if (((char)iVar6 != '\0') && (options->force_install == false)) {
    if ((options->throw_on_origin_mismatch == true) &&
       ((db->config).options.allow_extensions_metadata_mismatch == false)) {
      local_90[0] = local_80;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_extension_path._M_dataplus._M_p,
                 local_extension_path._M_dataplus._M_p + local_extension_path._M_string_length);
      ::std::__cxx11::string::append((char *)local_90);
      iVar6 = (*fs->_vptr_FileSystem[0x12])(fs,local_90,0);
      cVar11 = (char)iVar6;
      bVar5 = true;
    }
    else {
      bVar5 = false;
      cVar11 = '\0';
    }
    if ((bVar5) && (local_90[0] != local_80)) {
      operator_delete(local_90[0]);
    }
    if (cVar11 != '\0') {
      local_1f8.ptr = (options->repository).ptr;
      resolved_repository.name._M_dataplus._M_p = (pointer)&resolved_repository.name.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&resolved_repository,local_extension_path._M_dataplus._M_p,
                 local_extension_path._M_dataplus._M_p + local_extension_path._M_string_length);
      ::std::__cxx11::string::append((char *)&resolved_repository);
      ExtensionInstallInfo::TryReadInfoFile
                ((ExtensionInstallInfo *)&install_info,fs,&resolved_repository.name,&extension_name)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)resolved_repository.name._M_dataplus._M_p != &resolved_repository.name.field_2) {
        operator_delete(resolved_repository.name._M_dataplus._M_p);
      }
      resolved_repository.name._M_dataplus._M_p = (pointer)&resolved_repository.name.field_2;
      repo._M_dataplus._M_p = (pointer)0xfb;
      pcVar8 = (pointer)::std::__cxx11::string::_M_create
                                  ((ulong *)&resolved_repository,(ulong)&repo);
      _Var4 = repo._M_dataplus;
      resolved_repository.name.field_2._M_allocated_capacity = (size_type)repo._M_dataplus._M_p;
      resolved_repository.name._M_dataplus._M_p = pcVar8;
      switchD_015ff80e::default
                (pcVar8,
                 "Installing extension \'%s\' failed. The extension is already installed but the origin is different.\nCurrently installed extension is from %s \'%s\', while the extension to be installed is from %s \'%s\'.\nTo solve this rerun this command with `FORCE INSTALL`"
                 ,0xfb);
      resolved_repository.name._M_string_length = (size_type)_Var4._M_p;
      pcVar8[_Var4._M_p] = '\0';
      repo.field_2._M_allocated_capacity = 0x6f7469736f706572;
      repo.field_2._8_2_ = 0x7972;
      repo._M_string_length = 10;
      repo.field_2._M_local_buf[10] = '\0';
      paVar3 = &custom_path.field_2;
      custom_path.field_2._M_allocated_capacity._0_7_ = 0x5f6d6f74737563;
      custom_path.field_2._7_4_ = 0x68746170;
      custom_path._M_string_length = 0xb;
      custom_path.field_2._M_local_buf[0xb] = '\0';
      repo._M_dataplus._M_p = (pointer)paVar2;
      custom_path._M_dataplus._M_p = (pointer)paVar3;
      if (install_info.
          super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
           )0x0) {
        pEVar9 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                 ::operator->(&install_info);
        if ((pEVar9->mode == REPOSITORY) && (local_1f8.ptr != (ExtensionRepository *)0x0)) {
          pEVar9 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                   ::operator->(&install_info);
          optional_ptr<duckdb::ExtensionRepository,_true>::CheckValid(&local_1f8);
          __n = (pEVar9->repository_url)._M_string_length;
          if (__n != ((local_1f8.ptr)->path)._M_string_length) {
LAB_00f76575:
            pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,extension_name._M_dataplus._M_p,
                       extension_name._M_dataplus._M_p + extension_name._M_string_length);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,repo._M_dataplus._M_p,
                       repo._M_dataplus._M_p + repo._M_string_length);
            pEVar9 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                     ::operator->(&install_info);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            pcVar8 = (pEVar9->repository_url)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_130,pcVar8,
                       pcVar8 + (pEVar9->repository_url)._M_string_length);
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,repo._M_dataplus._M_p,
                       repo._M_dataplus._M_p + repo._M_string_length);
            optional_ptr<duckdb::ExtensionRepository,_true>::CheckValid(&local_1f8);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            pcVar8 = ((local_1f8.ptr)->path)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar8,pcVar8 + ((local_1f8.ptr)->path)._M_string_length)
            ;
            InvalidInputException::
            InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (pIVar10,&resolved_repository.name,&local_d0,&local_110,&local_130,&local_150,
                       &local_f0);
            __cxa_throw(pIVar10,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          if (__n != 0) {
            iVar6 = bcmp((pEVar9->repository_url)._M_dataplus._M_p,
                         ((local_1f8.ptr)->path)._M_dataplus._M_p,__n);
            if (iVar6 != 0) goto LAB_00f76575;
          }
        }
        pEVar9 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                 ::operator->(&install_info);
        if (pEVar9->mode == REPOSITORY) {
          bVar5 = IsFullPath(extension);
          if (bVar5) {
            pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,extension_name._M_dataplus._M_p,
                       extension_name._M_dataplus._M_p + extension_name._M_string_length);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,repo._M_dataplus._M_p,
                       repo._M_dataplus._M_p + repo._M_string_length);
            pEVar9 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                     ::operator->(&install_info);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            pcVar8 = (pEVar9->repository_url)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_130,pcVar8,
                       pcVar8 + (pEVar9->repository_url)._M_string_length);
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,custom_path._M_dataplus._M_p,
                       custom_path._M_dataplus._M_p + custom_path._M_string_length);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            pcVar8 = (extension->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar8,pcVar8 + extension->_M_string_length);
            InvalidInputException::
            InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (pIVar10,&resolved_repository.name,&local_d0,&local_110,&local_130,&local_150,
                       &local_f0);
            __cxa_throw(pIVar10,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)custom_path._M_dataplus._M_p != paVar3) {
        operator_delete(custom_path._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)repo._M_dataplus._M_p != paVar2) {
        operator_delete(repo._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)resolved_repository.name._M_dataplus._M_p != &resolved_repository.name.field_2) {
        operator_delete(resolved_repository.name._M_dataplus._M_p);
      }
      if (install_info.
          super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
           )0x0) {
        ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                  ((default_delete<duckdb::ExtensionInstallInfo> *)&install_info,
                   (ExtensionInstallInfo *)
                   install_info.
                   super_unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
                   .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl);
      }
    }
    *(undefined8 *)this = 0;
    goto LAB_00f7646f;
  }
  iVar6 = (*fs->_vptr_FileSystem[0x12])(fs,&temp_path,0);
  if ((char)iVar6 != '\0') {
    (*fs->_vptr_FileSystem[0x14])(fs,&temp_path,0);
  }
  bVar5 = IsFullPath(extension);
  if (bVar5 && (options->repository).ptr != (ExtensionRepository *)0x0) {
    pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    resolved_repository.name._M_dataplus._M_p = (pointer)&resolved_repository.name.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&resolved_repository,"Cannot pass both a repository and a full path url",""
              );
    InvalidInputException::InvalidInputException(pIVar10,&resolved_repository.name);
    __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ExtensionRepository::ExtensionRepository(&resolved_repository);
  bVar5 = IsFullPath(extension);
  if (!bVar5 && (options->repository).ptr == (ExtensionRepository *)0x0) {
    ExtensionRepository::GetDefaultRepository((optional_ptr<duckdb::DBConfig,_true>)0xf75f3e);
    ::std::__cxx11::string::operator=((string *)&resolved_repository,(string *)&repo);
    ::std::__cxx11::string::operator=
              ((string *)&resolved_repository.path,(string *)local_1d0._M_local_buf);
    if ((undefined1 *)local_1d0._M_allocated_capacity != local_1c0) {
      operator_delete((void *)local_1d0._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)repo._M_dataplus._M_p != &repo.field_2) {
      operator_delete(repo._M_dataplus._M_p);
    }
    (options->repository).ptr = &resolved_repository;
  }
  bVar5 = IsFullPath(extension);
  if (bVar5) {
    bVar5 = IsHTTP(extension);
    if (bVar5) goto LAB_00f75fbb;
    repo._M_dataplus._M_p = (pointer)&PTR__FileSystem_0247f488;
    DirectInstallExtension
              ((duckdb *)this,db,(FileSystem *)&repo,extension,&temp_path,extension,
               &local_extension_path,options,context);
LAB_00f761a2:
    FileSystem::~FileSystem((FileSystem *)&repo);
  }
  else {
LAB_00f75fbb:
    if ((options->repository).ptr != (ExtensionRepository *)0x0) {
      optional_ptr<duckdb::ExtensionRepository,_true>::CheckValid(&options->repository);
      bVar5 = IsHTTP(&((options->repository).ptr)->path);
      if (!bVar5) {
        repo._M_dataplus._M_p = (pointer)&PTR__FileSystem_0247f488;
        InstallFromRepository
                  ((DatabaseInstance *)this,(FileSystem *)db,(string *)fs,&extension_name,&temp_path
                   ,&local_extension_path,options,http_logger,context);
        goto LAB_00f761a2;
      }
    }
    bVar5 = IsFullPath(extension);
    if (bVar5) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar8 = (extension->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar8,pcVar8 + extension->_M_string_length);
      local_50.field_2._M_allocated_capacity._0_4_ = 0x70747468;
      local_50.field_2._M_allocated_capacity._4_3_ = 0x2f2f3a;
      local_50._M_string_length = 7;
      local_50.field_2._M_local_buf[7] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      bVar5 = StringUtil::StartsWith(&local_b0,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (bVar5) {
        InstallFromHttpUrl((duckdb *)this,db,extension,&extension_name,&temp_path,
                           &local_extension_path,options,http_logger);
      }
      else {
        DirectInstallExtension
                  ((duckdb *)this,db,fs,extension,&temp_path,extension,&local_extension_path,options
                   ,context);
      }
    }
    else {
      InstallFromRepository
                ((DatabaseInstance *)this,(FileSystem *)db,(string *)fs,&extension_name,&temp_path,
                 &local_extension_path,options,http_logger,context);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resolved_repository.path._M_dataplus._M_p != &resolved_repository.path.field_2) {
    operator_delete(resolved_repository.path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resolved_repository.name._M_dataplus._M_p != &resolved_repository.name.field_2) {
    operator_delete(resolved_repository.name._M_dataplus._M_p);
  }
LAB_00f7646f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)temp_path._M_dataplus._M_p != &temp_path.field_2) {
    operator_delete(temp_path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_extension_path._M_dataplus._M_p != &local_extension_path.field_2) {
    operator_delete(local_extension_path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)extension_name._M_dataplus._M_p != &extension_name.field_2) {
    operator_delete(extension_name._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          )(unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            )this;
}

Assistant:

unique_ptr<ExtensionInstallInfo>
ExtensionHelper::InstallExtensionInternal(DatabaseInstance &db, FileSystem &fs, const string &local_path,
                                          const string &extension, ExtensionInstallOptions &options,
                                          optional_ptr<HTTPLogger> http_logger, optional_ptr<ClientContext> context) {
#ifdef DUCKDB_DISABLE_EXTENSION_LOAD
	throw PermissionException("Installing external extensions is disabled through a compile time flag");
#else
	if (!db.config.options.enable_external_access) {
		throw PermissionException("Installing extensions is disabled through configuration");
	}

	auto extension_name = ApplyExtensionAlias(fs.ExtractBaseName(extension));
	string local_extension_path = fs.JoinPath(local_path, extension_name + ".duckdb_extension");
	string temp_path = local_extension_path + ".tmp-" + UUID::ToString(UUID::GenerateRandomUUID());

	if (fs.FileExists(local_extension_path) && !options.force_install) {
		// File exists: throw error if origin mismatches
		if (options.throw_on_origin_mismatch && !db.config.options.allow_extensions_metadata_mismatch &&
		    fs.FileExists(local_extension_path + ".info")) {
			ThrowErrorOnMismatchingExtensionOrigin(fs, local_extension_path, extension_name, extension,
			                                       options.repository);
		}

		// File exists, but that's okay, install is now a NOP
		return nullptr;
	}

	if (fs.FileExists(temp_path)) {
		fs.RemoveFile(temp_path);
	}

	if (ExtensionHelper::IsFullPath(extension) && options.repository) {
		throw InvalidInputException("Cannot pass both a repository and a full path url");
	}

	// Resolve default repository if there is none set
	ExtensionRepository resolved_repository;
	if (!ExtensionHelper::IsFullPath(extension) && !options.repository) {
		resolved_repository = ExtensionRepository::GetDefaultRepository(db.config);
		options.repository = resolved_repository;
	}

	// Install extension from local, direct url
	if (ExtensionHelper::IsFullPath(extension) && !IsHTTP(extension)) {
		LocalFileSystem local_fs;
		return DirectInstallExtension(db, local_fs, extension, temp_path, extension, local_extension_path, options,
		                              context);
	}

	// Install extension from local url based on a repository (Note that this will install it as a local file)
	if (options.repository && !IsHTTP(options.repository->path)) {
		LocalFileSystem local_fs;
		return InstallFromRepository(db, fs, extension, extension_name, temp_path, local_extension_path, options,
		                             http_logger, context);
	}

#ifdef DISABLE_DUCKDB_REMOTE_INSTALL
	throw BinderException("Remote extension installation is disabled through configuration");
#else

	// Full path direct installation
	if (IsFullPath(extension)) {
		if (StringUtil::StartsWith(extension, "http://")) {
			// HTTP takes separate path to avoid dependency on httpfs extension
			return InstallFromHttpUrl(db, extension, extension_name, temp_path, local_extension_path, options,
			                          http_logger);
		}

		// Direct installation from local or remote path
		return DirectInstallExtension(db, fs, extension, temp_path, extension, local_extension_path, options, context);
	}

	// Repository installation
	return InstallFromRepository(db, fs, extension, extension_name, temp_path, local_extension_path, options,
	                             http_logger, context);
#endif
#endif
}